

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_open_memory(mtar_t *tar,void *data,size_t size)

{
  void *pvVar1;
  
  pvVar1 = data;
  if (size == 0) {
    pvVar1 = (void *)0x0;
  }
  if (data == (void *)0x0) {
    size = 0;
  }
  tar->pos = 0;
  tar->remaining_data = 0;
  tar->last_header = 0;
  tar->write = memory_write;
  tar->read = memory_read;
  tar->seek = memory_seek;
  tar->close = memory_close;
  tar->stream = pvVar1;
  tar->memory = (void *)0x0;
  tar->memory_pos = 0;
  tar->memory_size = size;
  tar->memory_capacity = 0;
  return 0;
}

Assistant:

int mtar_open_memory(mtar_t *tar, void *data, size_t size) {
  if (!data || !size) {
    data = NULL;
    size = 0;
  }

  /* Init tar struct and functions */
  memset(tar, 0, sizeof(*tar));
  tar->write = memory_write;
  tar->read = memory_read;
  tar->seek = memory_seek;
  tar->close = memory_close;
  tar->stream = data;   /* for input */
  tar->memory = NULL;   /* for output */
  tar->memory_pos = 0;
  tar->memory_size = size;
  tar->memory_capacity = 0;

  /* Return ok */
  return MTAR_ESUCCESS;
}